

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O0

CFeeRate wallet::EstimateFeeRate
                   (CWallet *wallet,CWalletTx *wtx,CAmount old_fee,CCoinControl *coin_control)

{
  int iVar1;
  FeeCalculation *feeCalc;
  Chain *pCVar2;
  undefined4 extraout_var;
  CFeeRate *pCVar3;
  CCoinControl *in_RCX;
  CWallet *in_RSI;
  long in_FS_OFFSET;
  int64_t txSize;
  CFeeRate min_feerate;
  CFeeRate wallet_incremental_relay_fee;
  CFeeRate node_incremental_relay_fee;
  CFeeRate feerate;
  CTransaction *in_stack_ffffffffffffff78;
  CWallet *in_stack_ffffffffffffff88;
  CFeeRate *this;
  CFeeRate *in_stack_ffffffffffffff98;
  CFeeRate local_38;
  undefined8 local_30;
  CFeeRate local_28;
  CAmount local_20 [2];
  CAmount local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff88);
  feeCalc = (FeeCalculation *)GetVirtualTransactionSize(in_stack_ffffffffffffff78);
  CFeeRate::CFeeRate(in_stack_ffffffffffffff98,local_20,
                     (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  pCVar3 = &local_28;
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff78,0);
  CFeeRate::operator+=((CFeeRate *)in_stack_ffffffffffffff88,pCVar3);
  pCVar2 = CWallet::chain(in_stack_ffffffffffffff88);
  iVar1 = (*pCVar2->_vptr_Chain[0x1f])();
  local_30 = CONCAT44(extraout_var,iVar1);
  this = &local_38;
  CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffff78,0x17bc0c7);
  std::max<CFeeRate>(pCVar3,(CFeeRate *)in_stack_ffffffffffffff78);
  CFeeRate::operator+=(this,pCVar3);
  GetMinimumFeeRate(in_RSI,in_RCX,feeCalc);
  pCVar3 = std::max<CFeeRate>(pCVar3,(CFeeRate *)in_stack_ffffffffffffff78);
  local_10 = pCVar3->nSatoshisPerK;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (CFeeRate)local_10;
  }
  __stack_chk_fail();
}

Assistant:

static CFeeRate EstimateFeeRate(const CWallet& wallet, const CWalletTx& wtx, const CAmount old_fee, const CCoinControl& coin_control)
{
    // Get the fee rate of the original transaction. This is calculated from
    // the tx fee/vsize, so it may have been rounded down. Add 1 satoshi to the
    // result.
    int64_t txSize = GetVirtualTransactionSize(*(wtx.tx));
    CFeeRate feerate(old_fee, txSize);
    feerate += CFeeRate(1);

    // The node has a configurable incremental relay fee. Increment the fee by
    // the minimum of that and the wallet's conservative
    // WALLET_INCREMENTAL_RELAY_FEE value to future proof against changes to
    // network wide policy for incremental relay fee that our node may not be
    // aware of. This ensures we're over the required relay fee rate
    // (Rule 4).  The replacement tx will be at least as large as the
    // original tx, so the total fee will be greater (Rule 3)
    CFeeRate node_incremental_relay_fee = wallet.chain().relayIncrementalFee();
    CFeeRate wallet_incremental_relay_fee = CFeeRate(WALLET_INCREMENTAL_RELAY_FEE);
    feerate += std::max(node_incremental_relay_fee, wallet_incremental_relay_fee);

    // Fee rate must also be at least the wallet's GetMinimumFeeRate
    CFeeRate min_feerate(GetMinimumFeeRate(wallet, coin_control, /*feeCalc=*/nullptr));

    // Set the required fee rate for the replacement transaction in coin control.
    return std::max(feerate, min_feerate);
}